

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::InternalDeallocate<false>
          (RepeatedField<unsigned_int> *this)

{
  int iVar1;
  string *psVar2;
  void *ptr;
  RepeatedField<unsigned_long> *this_00;
  uint size;
  long lVar3;
  Chunk *pCVar4;
  __base_type _Var5;
  int iVar6;
  ulong in_RSI;
  __atomic_base<long> this_01;
  LongSooRep *this_02;
  SooRep *this_03;
  Arena *this_04;
  Arena *pAStack_a8;
  long lStack_a0;
  SooRep *pSStack_98;
  undefined1 auStack_90 [24];
  __atomic_base<long> _Stack_78;
  atomic<google::protobuf::internal::ThreadSafeArena::SerialArenaChunk_*> aStack_70;
  SooRep SStack_60;
  char *pcStack_50;
  Chunk *pCStack_48;
  LongSooRep LStack_40;
  undefined1 local_10 [16];
  
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0) {
    InternalDeallocate<false>(this);
    return;
  }
  this_01._M_i = (__int_type_conflict1)local_10;
  InternalDeallocate<false>((RepeatedField<unsigned_int> *)this_01._M_i);
  this_02 = &LStack_40;
  pCVar4 = (Chunk *)(in_RSI & 0xffffffff);
  iVar6 = 2;
  if ((int)in_RSI == 0) {
    iVar6 = *(int *)(this_01._M_i + 0xc);
  }
  if (iVar6 < (int)size) {
    pCStack_48 = (Chunk *)0x266a0d;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)(int)size,(long)iVar6,"size <= Capacity(is_soo)");
  }
  else {
    psVar2 = (string *)0x0;
  }
  if (psVar2 == (string *)0x0) {
    internal::SooRep::set_size((SooRep *)this_01._M_i,SUB81(pCVar4,0),size);
    return;
  }
  pCStack_48 = (Chunk *)RepeatedField<unsigned_long>::elements;
  set_size();
  _Var5._M_p = (__pointer_type)((ulong)psVar2 & 0xffffffff);
  iVar6 = 1;
  if ((int)psVar2 == 0) {
    iVar6 = this_02->capacity;
  }
  pcStack_50 = (char *)(ulong)size;
  pCStack_48 = pCVar4;
  if (iVar6 < 1) {
    aStack_70._M_b._M_p = (__base_type)(__pointer_type)0x266a6e;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar6,0,"Capacity(is_soo) > 0");
  }
  else {
    psVar2 = (string *)0x0;
  }
  if (psVar2 == (string *)0x0) {
    if ((char)_Var5._M_p != '\0') {
      return;
    }
    internal::LongSooRep::elements(this_02);
    return;
  }
  this_03 = &SStack_60;
  aStack_70._M_b._M_p = (__base_type)(__pointer_type)0x266a7d;
  RepeatedField<unsigned_long>::elements();
  this_04 = (Arena *)auStack_90;
  iVar6 = (int)psVar2;
  lVar3 = (long)iVar6;
  auStack_90._16_8_ = this_02;
  _Stack_78._M_i = this_01._M_i;
  aStack_70._M_b._M_p = (__base_type)(__base_type)_Var5._M_p;
  if (iVar6 < 0) {
    pSStack_98 = (SooRep *)0x266ae6;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>(lVar3,0,"index >= 0");
  }
  else {
    psVar2 = (string *)0x0;
  }
  if (psVar2 == (string *)0x0) {
    pSStack_98 = (SooRep *)0x266aab;
    iVar1 = internal::SooRep::size
                      (this_03,(undefined1  [16])
                               ((undefined1  [16])this_03->field_0 & (undefined1  [16])0x4) ==
                               (undefined1  [16])0x0);
    if (iVar6 < iVar1) {
      psVar2 = (string *)0x0;
    }
    else {
      pSStack_98 = (SooRep *)0x266afa;
      psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (lVar3,(long)iVar1,"index < size()");
    }
    if (psVar2 == (string *)0x0) {
      pSStack_98 = (SooRep *)0x266ac8;
      RepeatedField<unsigned_long>::elements
                ((RepeatedField<unsigned_long> *)this_03,
                 (undefined1  [16])((undefined1  [16])this_03->field_0 & (undefined1  [16])0x4) ==
                 (undefined1  [16])0x0);
      return;
    }
  }
  else {
    pSStack_98 = (SooRep *)0x266b07;
    RepeatedField<unsigned_long>::Mutable();
  }
  pSStack_98 = (SooRep *)
               Arena::CreateArenaCompatible<google::protobuf::RepeatedField<unsigned_long>>;
  RepeatedField<unsigned_long>::Mutable();
  lStack_a0 = lVar3;
  pSStack_98 = this_03;
  if (this_04 == (Arena *)0x0) {
    this_00 = (RepeatedField<unsigned_long> *)operator_new(0x10);
    RepeatedField<unsigned_long>::RepeatedField(this_00,(Arena *)0x0);
  }
  else {
    ptr = Arena::Allocate(this_04,0x10);
    pAStack_a8 = this_04;
    Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_long>>::
    Construct<google::protobuf::Arena*>(ptr,&pAStack_a8);
  }
  return;
}

Assistant:

void InternalDeallocate() {
    ABSL_DCHECK(!is_soo());
    const size_t bytes = Capacity(false) * sizeof(Element) + kHeapRepHeaderSize;
    if (heap_rep()->arena == nullptr) {
      internal::SizedDelete(heap_rep(), bytes);
    } else if (!in_destructor) {
      // If we are in the destructor, we might be being destroyed as part of
      // the arena teardown. We can't try and return blocks to the arena then.
      heap_rep()->arena->ReturnArrayMemory(heap_rep(), bytes);
    }
  }